

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Scl_LibertyReadLoadUnit(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  uint uVar1;
  Scl_Item_t *pSVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  Scl_Item_t *pSVar8;
  size_t __size;
  double dVar9;
  
  pSVar2 = p->pItems;
  uVar1 = pSVar2->Child;
  iVar6 = p->nItems;
  if (iVar6 <= (int)uVar1) {
LAB_003d092d:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (pSVar2 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
    pSVar8 = pSVar2 + uVar1;
    pcVar7 = p->pContents;
    do {
      iVar5 = (pSVar8->Key).Beg;
      iVar4 = (pSVar8->Key).End - iVar5;
      iVar5 = strncmp(pcVar7 + iVar5,"capacitive_load_unit",(long)iVar4);
      if (iVar4 == 0x14 && iVar5 == 0) {
        pcVar7 = Scl_LibertyReadString(p,pSVar8->Head);
        pcVar7 = strtok(pcVar7," \t\n\r\\\",");
        dVar9 = atof(pcVar7);
        pcVar7 = strtok((char *)0x0," \t\n\r\\\",");
        Vec_StrPutF_(vOut,(float)dVar9);
        if (pcVar7 != (char *)0x0) {
          iVar6 = strcmp(pcVar7,"pf");
          if (iVar6 == 0) goto LAB_003d0828;
          iVar6 = strcmp(pcVar7,"ff");
          if (iVar6 == 0) {
            uVar1 = vOut->nCap;
            cVar3 = '\x0f';
            if (vOut->nSize != uVar1) goto LAB_003d089c;
            if ((int)uVar1 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              vOut->pArray = pcVar7;
              cVar3 = '\x0f';
              goto LAB_003d087c;
            }
            __size = (ulong)uVar1 * 2;
            if ((int)__size <= (int)uVar1) goto LAB_003d089c;
            if (vOut->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(__size);
            }
            else {
              pcVar7 = (char *)realloc(vOut->pArray,__size);
            }
            vOut->pArray = pcVar7;
            cVar3 = '\x0f';
            goto LAB_003d0899;
          }
        }
        break;
      }
      uVar1 = pSVar8->Next;
      if (iVar6 <= (int)uVar1) goto LAB_003d092d;
      pSVar8 = pSVar2 + uVar1;
      if ((int)uVar1 < 0) {
        pSVar8 = (Scl_Item_t *)0x0;
      }
    } while (pSVar8 != (Scl_Item_t *)0x0);
  }
  puts("Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf)."
      );
  Vec_StrPutF_(vOut,1.0);
LAB_003d0828:
  uVar1 = vOut->nCap;
  cVar3 = '\f';
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar7;
      cVar3 = '\f';
LAB_003d087c:
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_003d089c;
      if (vOut->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(__size);
      }
      else {
        pcVar7 = (char *)realloc(vOut->pArray,__size);
      }
      vOut->pArray = pcVar7;
      cVar3 = '\f';
    }
LAB_003d0899:
    vOut->nCap = (int)__size;
  }
LAB_003d089c:
  iVar6 = vOut->nSize;
  vOut->nSize = iVar6 + 1;
  vOut->pArray[iVar6] = cVar3;
  return;
}

Assistant:

void Scl_LibertyReadLoadUnit( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "capacitive_load_unit" )
    {
        // expecting (1.00,ff) or (1, pf) ... 12 or 15 for 'pf' or 'ff'
        char * pHead   = Scl_LibertyReadString(p, pItem->Head);
        float First    = atof(strtok(pHead, " \t\n\r\\\","));
        char * pSecond = strtok(NULL, " \t\n\r\\\",");
        Vec_StrPutF_( vOut, First );
        if ( pSecond && !strcmp(pSecond, "pf") )
            Vec_StrPutI_( vOut, 12 );
        else if ( pSecond && !strcmp(pSecond, "ff") )
            Vec_StrPutI_( vOut, 15 );
        else break;
        return;
    }
    printf( "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf).\n" );
    Vec_StrPutF_( vOut, 1.0 );
    Vec_StrPutI_( vOut, 12 );
}